

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::PipelineResourceSignatureGLImpl::InitSRBResourceCache
          (PipelineResourceSignatureGLImpl *this,ShaderResourceCacheGL *ResourceCache)

{
  Uint32 UVar1;
  IMemoryAllocator *MemAllocator;
  PipelineResourceDesc *pPVar2;
  PipelineResourceAttribsType *Res;
  Char *Message;
  uint local_70;
  Uint32 ArrInd;
  undefined1 local_60 [8];
  string msg;
  ISampler *pSampler;
  Uint32 ImtblSamplerIdx;
  PipelineResourceAttribsType *ResAttr;
  PipelineResourceDesc *ResDesc;
  Uint32 r;
  ShaderResourceCacheGL *ResourceCache_local;
  PipelineResourceSignatureGLImpl *this_local;
  
  MemAllocator = SRBMemoryAllocator::GetResourceCacheDataAllocator
                           (&(this->
                             super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
                             m_SRBMemAllocator,0);
  ShaderResourceCacheGL::Initialize
            (ResourceCache,
             (TResourceCount *)
             &(this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).field_0xd2,
             MemAllocator,this->m_DynamicUBOMask,this->m_DynamicSSBOMask);
  for (ResDesc._4_4_ = 0;
      ResDesc._4_4_ <
      (this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
      .m_Desc.NumResources; ResDesc._4_4_ = ResDesc._4_4_ + 1) {
    pPVar2 = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceDesc
                       (&this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                        ResDesc._4_4_);
    Res = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceAttribs
                    (&this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                     ResDesc._4_4_);
    if ((pPVar2->ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV) &&
       (UVar1 = GetImmutableSamplerIdx(this,Res), UVar1 != 0xffffffff)) {
      msg.field_2._8_8_ =
           Diligent::RefCntAutoPtr::operator_cast_to_SamplerGLImpl_
                     ((RefCntAutoPtr *)
                      ((this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
                       m_pImmutableSamplers + UVar1));
      if ((SamplerGLImpl *)msg.field_2._8_8_ == (SamplerGLImpl *)0x0) {
        FormatString<char[53]>
                  ((string *)local_60,
                   (char (*) [53])"Immutable sampler is not initialized - this is a bug");
        Message = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (Message,"InitSRBResourceCache",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
                   ,0x210);
        std::__cxx11::string::~string((string *)local_60);
      }
      for (local_70 = 0; local_70 < pPVar2->ArraySize; local_70 = local_70 + 1) {
        ShaderResourceCacheGL::SetSampler
                  (ResourceCache,Res->CacheOffset + local_70,(ISampler *)msg.field_2._8_8_);
      }
    }
  }
  return;
}

Assistant:

void PipelineResourceSignatureGLImpl::InitSRBResourceCache(ShaderResourceCacheGL& ResourceCache)
{
    ResourceCache.Initialize(m_BindingCount, m_SRBMemAllocator.GetResourceCacheDataAllocator(0), m_DynamicUBOMask, m_DynamicSSBOMask);

    // Initialize immutable samplers
    for (Uint32 r = 0; r < m_Desc.NumResources; ++r)
    {
        const auto& ResDesc = GetResourceDesc(r);
        const auto& ResAttr = GetResourceAttribs(r);

        if (ResDesc.ResourceType != SHADER_RESOURCE_TYPE_TEXTURE_SRV)
            continue;

        const auto ImtblSamplerIdx = GetImmutableSamplerIdx(ResAttr);
        if (ImtblSamplerIdx != InvalidImmutableSamplerIndex)
        {
            ISampler* pSampler = m_pImmutableSamplers[ImtblSamplerIdx];
            VERIFY(pSampler != nullptr, "Immutable sampler is not initialized - this is a bug");

            for (Uint32 ArrInd = 0; ArrInd < ResDesc.ArraySize; ++ArrInd)
                ResourceCache.SetSampler(ResAttr.CacheOffset + ArrInd, pSampler);
        }
    }
}